

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddSecDiffCheck(DdManager *table,int x,int y)

{
  DdSubtable *pDVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 0;
  if (x != 0) {
    pDVar1 = table->subtables;
    if ((double)pDVar1[y].keys / (double)pDVar1[x].keys -
        (double)pDVar1[x].keys / (double)pDVar1[(long)x + -1].keys < (double)table->recomb / 100.0)
    {
      iVar3 = cuddTestInteract(table,table->invperm[x],table->invperm[y]);
      uVar2 = (uint)(iVar3 != 0);
    }
  }
  return uVar2;
}

Assistant:

static int
ddSecDiffCheck(
  DdManager * table,
  int  x,
  int  y)
{
    double Nx,Nx_1;
    double Sx;
    double threshold;
    int    xindex,yindex;

    if (x==0) return(0);

#ifdef DD_STATS
    secdiffcalls++;
#endif
    Nx = (double) table->subtables[x].keys;
    Nx_1 = (double) table->subtables[x-1].keys;
    Sx = (table->subtables[y].keys/Nx) - (Nx/Nx_1);

    threshold = table->recomb / 100.0;
    if (Sx < threshold) {
        xindex = table->invperm[x];
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
            (void) fprintf(table->out,
                           "Second difference for %d = %g Pos(%d)\n",
                           table->invperm[x],Sx,x);
#endif
#ifdef DD_STATS
            secdiff++;
#endif
            return(1);
        } else {
#ifdef DD_STATS
            secdiffmisfire++;
#endif
            return(0);
        }

    }
    return(0);

}